

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.cpp
# Opt level: O0

void __thiscall Writer::functionDefinitions(Writer *this,Program *program)

{
  bool bVar1;
  int iVar2;
  Writer *this_00;
  reference ppFVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pBVar4;
  StrRef in_RDI;
  const_iterator cVar5;
  Block *block;
  pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>
  *blockEntry;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<const_llvm::BasicBlock_*,_std::unique_ptr<Block,_std::default_delete<Block>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>_>_>
  *__range2_1;
  Value **var;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Value_*,_std::allocator<Value_*>_> *__range2;
  Func *func_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_Func_*,_std::allocator<const_Func_*>_> *__range1_1;
  Func *func;
  DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_> *pair;
  const_iterator __end1;
  const_iterator __begin1;
  DenseMap<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>
  *__range1;
  vector<const_Func_*,_std::allocator<const_Func_*>_> functions;
  StrRef in_stack_fffffffffffffe38;
  Func *in_stack_fffffffffffffe40;
  Writer *in_stack_fffffffffffffe48;
  StrRef in_stack_fffffffffffffe50;
  Block *in_stack_fffffffffffffea8;
  Writer *in_stack_fffffffffffffeb0;
  _Self local_120;
  _Self local_118;
  map<const_llvm::BasicBlock_*,_std::unique_ptr<Block,_std::default_delete<Block>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>_>_>
  *local_110;
  string local_108 [32];
  string local_e8 [32];
  reference local_c8;
  Value **local_c0;
  __normal_iterator<Value_*const_*,_std::vector<Value_*,_std::allocator<Value_*>_>_> local_b8;
  vector<Value_*,_std::allocator<Value_*>_> *local_b0;
  Func *local_a8;
  Func **local_a0;
  __normal_iterator<const_Func_**,_std::vector<const_Func_*,_std::allocator<const_Func_*>_>_>
  local_98;
  undefined1 *local_90;
  Func **local_80;
  Func **local_78;
  pointer local_70;
  reference local_68;
  const_iterator local_60;
  undefined1 in_stack_ffffffffffffffb7;
  Func *in_stack_ffffffffffffffb8;
  undefined1 local_28 [40];
  
  std::vector<const_Func_*,_std::allocator<const_Func_*>_>::vector
            ((vector<const_Func_*,_std::allocator<const_Func_*>_> *)0x2aae11);
  cVar5 = llvm::
          DenseMapBase<llvm::DenseMap<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>,_const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>
          ::begin((DenseMapBase<llvm::DenseMap<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>,_const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>
                   *)in_stack_fffffffffffffe50);
  this_00 = (Writer *)cVar5.Ptr;
  local_60 = llvm::
             DenseMapBase<llvm::DenseMap<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>,_const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>
             ::end((DenseMapBase<llvm::DenseMap<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>,_const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>_>
                    *)in_stack_fffffffffffffe40);
  while( true ) {
    bVar1 = llvm::operator!=((DenseMapIterator<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>,_true>
                              *)in_stack_fffffffffffffe40,
                             (DenseMapIterator<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>,_true>
                              *)in_stack_fffffffffffffe38);
    if (!bVar1) break;
    local_68 = llvm::
               DenseMapIterator<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>,_true>
               ::operator*((DenseMapIterator<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>,_true>
                            *)in_stack_fffffffffffffe38);
    local_70 = std::unique_ptr<Func,_std::default_delete<Func>_>::get
                         ((unique_ptr<Func,_std::default_delete<Func>_> *)in_stack_fffffffffffffe40)
    ;
    if ((local_70->isDeclaration & 1U) == 0) {
      bVar1 = isFunctionPrinted(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      if (bVar1) {
        std::vector<const_Func_*,_std::allocator<const_Func_*>_>::push_back
                  ((vector<const_Func_*,_std::allocator<const_Func_*>_> *)in_stack_fffffffffffffe50,
                   (value_type *)in_stack_fffffffffffffe48);
      }
    }
    llvm::
    DenseMapIterator<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>,_true>
    ::operator++((DenseMapIterator<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>,_llvm::DenseMapInfo<const_llvm::Function_*,_void>,_llvm::detail::DenseMapPair<const_llvm::Function_*,_std::unique_ptr<Func,_std::default_delete<Func>_>_>,_true>
                  *)in_stack_fffffffffffffe38);
  }
  local_78 = (Func **)std::vector<const_Func_*,_std::allocator<const_Func_*>_>::begin
                                ((vector<const_Func_*,_std::allocator<const_Func_*>_> *)
                                 in_stack_fffffffffffffe38);
  local_80 = (Func **)std::vector<const_Func_*,_std::allocator<const_Func_*>_>::end
                                ((vector<const_Func_*,_std::allocator<const_Func_*>_> *)
                                 in_stack_fffffffffffffe38);
  std::
  sort<__gnu_cxx::__normal_iterator<Func_const**,std::vector<Func_const*,std::allocator<Func_const*>>>,Writer::functionDefinitions(Program_const&)::__0>
            (local_78,local_80);
  local_90 = local_28;
  local_98._M_current =
       (Func **)std::vector<const_Func_*,_std::allocator<const_Func_*>_>::begin
                          ((vector<const_Func_*,_std::allocator<const_Func_*>_> *)
                           in_stack_fffffffffffffe38);
  local_a0 = (Func **)std::vector<const_Func_*,_std::allocator<const_Func_*>_>::end
                                ((vector<const_Func_*,_std::allocator<const_Func_*>_> *)
                                 in_stack_fffffffffffffe38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Func_**,_std::vector<const_Func_*,_std::allocator<const_Func_*>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<const_Func_**,_std::vector<const_Func_*,_std::allocator<const_Func_*>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<const_Func_**,_std::vector<const_Func_*,_std::allocator<const_Func_*>_>_>
              ::operator*(&local_98);
    local_a8 = *ppFVar3;
    functionHead(this_00,in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    CWriter::startFunctionBody((CWriter *)0x2ab03f);
    local_b0 = &local_a8->variables;
    local_b8._M_current =
         (Value **)
         std::vector<Value_*,_std::allocator<Value_*>_>::begin
                   ((vector<Value_*,_std::allocator<Value_*>_> *)in_stack_fffffffffffffe38);
    local_c0 = (Value **)
               std::vector<Value_*,_std::allocator<Value_*>_>::end
                         ((vector<Value_*,_std::allocator<Value_*>_> *)in_stack_fffffffffffffe38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Value_*const_*,_std::vector<Value_*,_std::allocator<Value_*>_>_>
                          *)in_stack_fffffffffffffe40,
                         (__normal_iterator<Value_*const_*,_std::vector<Value_*,_std::allocator<Value_*>_>_>
                          *)in_stack_fffffffffffffe38);
      if (!bVar1) break;
      local_c8 = __gnu_cxx::
                 __normal_iterator<Value_*const_*,_std::vector<Value_*,_std::allocator<Value_*>_>_>
                 ::operator*(&local_b8);
      CWriter::indent((CWriter *)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe50 = in_RDI;
      iVar2 = (*((*local_c8)->super_ExprBase).super_Expr._vptr_Expr[4])();
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))(local_e8);
      iVar2 = (*((*local_c8)->super_ExprBase).super_Expr._vptr_Expr[4])();
      in_stack_fffffffffffffe48 = (Writer *)CONCAT44(extraout_var_00,iVar2);
      (**(code **)((in_stack_fffffffffffffe48->wr).out + 0x20))
                (local_108,in_stack_fffffffffffffe48,&(*local_c8)->valueName);
      CWriter::declareVar((CWriter *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                          (StrRef)0x2ab15e);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_e8);
      __gnu_cxx::__normal_iterator<Value_*const_*,_std::vector<Value_*,_std::allocator<Value_*>_>_>
      ::operator++(&local_b8);
    }
    writeBlock(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_110 = &local_a8->blockMap;
    local_118._M_node =
         (_Base_ptr)
         std::
         map<const_llvm::BasicBlock_*,_std::unique_ptr<Block,_std::default_delete<Block>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>_>_>
         ::begin((map<const_llvm::BasicBlock_*,_std::unique_ptr<Block,_std::default_delete<Block>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>_>_>
                  *)in_stack_fffffffffffffe38);
    local_120._M_node =
         (_Base_ptr)
         std::
         map<const_llvm::BasicBlock_*,_std::unique_ptr<Block,_std::default_delete<Block>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>_>_>
         ::end((map<const_llvm::BasicBlock_*,_std::unique_ptr<Block,_std::default_delete<Block>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>_>_>
                *)in_stack_fffffffffffffe38);
    while( true ) {
      bVar1 = std::operator!=(&local_118,&local_120);
      if (!bVar1) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>_>
                   *)in_stack_fffffffffffffe40);
      pBVar4 = std::unique_ptr<Block,_std::default_delete<Block>_>::get
                         ((unique_ptr<Block,_std::default_delete<Block>_> *)
                          in_stack_fffffffffffffe40);
      if ((pBVar4 != local_a8->entry) && ((pBVar4->doInline & 1U) == 0)) {
        writeBlock(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_llvm::BasicBlock_*const,_std::unique_ptr<Block,_std::default_delete<Block>_>_>_>
                    *)in_stack_fffffffffffffe40);
    }
    CWriter::endFunctionBody((CWriter *)0x2ab2ce);
    in_stack_fffffffffffffe40 = (Func *)&stack0xfffffffffffffeaf;
    in_stack_fffffffffffffe38 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffeb0,"",(allocator *)in_stack_fffffffffffffe40);
    CWriter::line((CWriter *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeaf);
    __gnu_cxx::
    __normal_iterator<const_Func_**,_std::vector<const_Func_*,_std::allocator<const_Func_*>_>_>::
    operator++(&local_98);
  }
  std::vector<const_Func_*,_std::allocator<const_Func_*>_>::~vector
            ((vector<const_Func_*,_std::allocator<const_Func_*>_> *)in_stack_fffffffffffffe50);
  return;
}

Assistant:

void Writer::functionDefinitions(const Program& program) {
    std::vector<const Func*> functions;

    for (const auto& pair : program.functions) {
        const auto* func = pair.second.get();
        if (func->isDeclaration) {
            continue;
        }

        if (!isFunctionPrinted(func)) {
            continue;
        }

        functions.push_back(func);
    }

    std::sort(functions.begin(), functions.end(), [](const Func* a, const Func* b){ return a->name <= b->name;});

    for (const auto* func : functions) {

        functionHead(func);
        wr.startFunctionBody();

        // start with variables
        for (const auto& var : func->variables) {
            wr.indent(1);
            wr.declareVar(var->getType()->toString(), var->getType()->surroundName(var->valueName));
        }

        assert(func->entry);
        writeBlock(func->entry);

        for (const auto& blockEntry : func->blockMap) {
            const auto* block = blockEntry.second.get();

            if (block == func->entry)
                continue;

            if (!block->doInline) {
                writeBlock(block);
            }
        }

        wr.endFunctionBody();
        wr.line("");
    }
}